

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O3

int __thiscall
Peers::broadcast(Peers *this,string *message,
                function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *callback
                )

{
  size_t in_RCX;
  int iVar1;
  int in_R8D;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  undefined1 auVar4 [16];
  
  p_Var2 = (this->m_peers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_peers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    do {
      Peer::send(*(Peer **)(p_Var2 + 2),(int)message,callback,in_RCX,in_R8D);
      iVar1 = iVar1 + 1;
      auVar4 = std::_Rb_tree_increment(p_Var2);
      callback = auVar4._8_8_;
      p_Var2 = auVar4._0_8_;
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return iVar1;
}

Assistant:

int Peers::broadcast(const std::string &message,
                     std::function<void(const std::unique_ptr<Peer> &)> callback)
{
    int sent = 0;
    for (const auto &[_, peer] : m_peers) {
        try {
            peer->send(message);
            ++sent;
        } catch (const PeerException &e) {
            if (callback != nullptr) {
                callback(peer);
                continue;
            }
            throw e;
        }
    }
    return sent;
}